

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjTransform(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,int n,uchar **dstBufs,
               unsigned_long *dstSizes,tjtransform *t,int flags)

{
  j_decompress_ptr cinfo;
  tjtransform *ptVar1;
  long lVar2;
  undefined1 auVar3 [16];
  JDIMENSION *pJVar4;
  int iVar5;
  int jpegSubsamp;
  boolean bVar6;
  int iVar7;
  undefined8 *puVar8;
  code **ppcVar9;
  void *pvVar10;
  long lVar11;
  jvirt_barray_ptr *src_coef_arrays;
  unsigned_long uVar12;
  jvirt_barray_ptr *coef_arrays;
  ulong uVar13;
  long lVar14;
  void *__dest;
  JDIMENSION *pJVar15;
  ulong uVar16;
  uint uVar17;
  int *piVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  char *pcVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  size_t __size;
  jpeg_transform_info *info;
  undefined1 auVar27 [16];
  tjregion tVar28;
  code *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  tjhandle local_38;
  
  if (handle == (tjhandle)0x0) {
    puVar8 = (undefined8 *)__tls_get_addr(&PTR_0019ef20);
    *(undefined8 *)((long)puVar8 + 7) = 0x656c646e616820;
    *puVar8 = 0x2064696c61766e49;
    return -1;
  }
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  if ((~*(uint *)((long)handle + 0x600) & 3) == 0) {
    auVar27._0_4_ = -(uint)(jpegBuf == (uchar *)0x0);
    auVar27._4_4_ = -(uint)(dstBufs == (uchar **)0x0);
    auVar27._8_4_ = -(uint)(dstSizes == (unsigned_long *)0x0);
    auVar27._12_4_ = -(uint)(t == (tjtransform *)0x0);
    iVar5 = movmskps(~*(uint *)((long)handle + 0x600),auVar27);
    if ((((iVar5 == 0) && (0 < n)) && (-1 < flags)) && (jpegSize != 0)) {
      if ((flags & 8U) == 0) {
        if ((flags & 0x10U) != 0) {
          pcVar23 = "JSIMD_FORCESSE=1";
          goto LAB_0013b490;
        }
        if ((flags & 0x20U) != 0) {
          pcVar23 = "JSIMD_FORCESSE2=1";
          goto LAB_0013b490;
        }
      }
      else {
        pcVar23 = "JSIMD_FORCEMMX=1";
LAB_0013b490:
        putenv(pcVar23);
      }
      if ((short)flags < 0) {
        ppcVar9 = &local_58;
        local_50 = 0;
        uStack_48 = 0;
        local_40 = 0;
        local_58 = my_progress_monitor;
        local_38 = handle;
      }
      else {
        ppcVar9 = (code **)0x0;
      }
      *(code ***)((long)handle + 0x218) = ppcVar9;
      __size = (ulong)(uint)n * 0x78;
      pvVar10 = calloc(1,__size);
      if (pvVar10 == (void *)0x0) {
        builtin_strncpy((char *)((long)handle + 0x621),"ocation ",8);
        builtin_strncpy((char *)((long)handle + 0x629),"failure",8);
        builtin_strncpy((char *)((long)handle + 0x618),"emory al",8);
        builtin_strncpy((char *)((long)handle + 0x620),"location",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
        builtin_strncpy((char *)((long)handle + 0x610),"orm(): M",8);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        pcVar23 = (char *)__tls_get_addr(&PTR_0019ef20);
        builtin_strncpy(pcVar23,"tjTransform(): Memory allocation failure",0x29);
        iVar5 = 1;
        pvVar10 = (void *)0x0;
      }
      else {
        iVar5 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
        if (iVar5 == 0) {
          jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
          piVar18 = &t->options;
          uVar24 = 0;
          uVar20 = uVar24;
          do {
            uVar22 = (uint)uVar20;
            uVar21 = piVar18[-1];
            *(JXFORM_CODE *)((long)pvVar10 + uVar24) = xformtypes[(int)uVar21];
            uVar17 = *piVar18;
            *(uint *)((long)pvVar10 + uVar24 + 4) = uVar17 & 1;
            *(uint *)((long)pvVar10 + uVar24 + 8) = uVar17 >> 1 & 1;
            *(uint *)((long)pvVar10 + uVar24 + 0xc) = uVar17 >> 3 & 1;
            uVar26 = uVar17 >> 2 & 1;
            *(uint *)((long)pvVar10 + uVar24 + 0x10) = uVar26;
            *(uint *)((long)pvVar10 + uVar24 + 0x14) = (uint)((long)(int)uVar21 == 1 && n != 1);
            if (uVar26 != 0) {
              *(int *)((long)pvVar10 + uVar24 + 0x28) = (((tjtransform *)(piVar18 + -5))->r).x;
              *(undefined4 *)((long)pvVar10 + uVar24 + 0x2c) = 1;
              *(int *)((long)pvVar10 + uVar24 + 0x30) = piVar18[-4];
              *(undefined4 *)((long)pvVar10 + uVar24 + 0x34) = 1;
              uVar21 = piVar18[-3];
              if (uVar21 != 0) {
                *(undefined4 *)((long)pvVar10 + uVar24 + 0x1c) = 1;
              }
              *(uint *)((long)pvVar10 + uVar24 + 0x18) = uVar21;
              if (piVar18[-2] == 0) {
                *(undefined4 *)((long)pvVar10 + uVar24 + 0x20) = 0;
              }
              else {
                *(int *)((long)pvVar10 + uVar24 + 0x20) = piVar18[-2];
                *(undefined4 *)((long)pvVar10 + uVar24 + 0x24) = 1;
              }
            }
            if ((uVar17 & 0x40) == 0) {
              uVar22 = 1;
            }
            uVar24 = uVar24 + 0x78;
            piVar18 = piVar18 + 10;
            uVar20 = (ulong)uVar22;
          } while (__size - uVar24 != 0);
          jcopy_markers_setup(cinfo,(uint)(uVar22 != 0) * 2);
          jpeg_read_header(cinfo,1);
          jpegSubsamp = getSubsamp(cinfo);
          if (-1 < jpegSubsamp) {
            piVar18 = &(t->r).y;
            lVar11 = 0;
            do {
              bVar6 = jtransform_request_workspace
                                (cinfo,(jpeg_transform_info *)(lVar11 + (long)pvVar10));
              if (bVar6 == 0) {
                builtin_strncpy((char *)((long)handle + 0x618),"ransform",8);
                builtin_strncpy((char *)((long)handle + 0x620)," is not ",8);
                builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
                builtin_strncpy((char *)((long)handle + 0x610),"orm(): T",8);
                *(undefined8 *)((long)handle + 0x628) = 0x74636566726570;
                *(undefined4 *)((long)handle + 0x6d0) = 1;
                pcVar23 = (char *)__tls_get_addr(&PTR_0019ef20);
                builtin_strncpy(pcVar23,"tjTransform(): Transform is not perfect",0x28);
LAB_0013bbc7:
                iVar5 = 1;
                goto LAB_0013bbd4;
              }
              if (*(int *)((long)pvVar10 + lVar11 + 0x10) != 0) {
                uVar21 = *(uint *)((long)pvVar10 + lVar11 + 0x70);
                if (((tjregion *)(piVar18 + -1))->x % (int)uVar21 == 0) {
                  uVar17 = *(uint *)((long)pvVar10 + lVar11 + 0x74);
                  if (*piVar18 % (int)uVar17 == 0) goto LAB_0013b751;
                }
                else {
                  uVar17 = *(uint *)((long)pvVar10 + lVar11 + 0x74);
                }
                snprintf((char *)((long)handle + 0x608),200,
                         "To crop this JPEG image, x must be a multiple of %d\nand y must be a multiple of %d.\n"
                         ,(ulong)uVar21,(ulong)uVar17);
                *(undefined4 *)((long)handle + 0x6d0) = 1;
                goto LAB_0013bbc7;
              }
LAB_0013b751:
              piVar18 = piVar18 + 10;
              lVar11 = lVar11 + 0x78;
            } while (__size - lVar11 != 0);
            src_coef_arrays = jpeg_read_coefficients(cinfo);
            iVar5 = 1;
            uVar20 = 0;
            do {
              info = (jpeg_transform_info *)(uVar20 * 0x78 + (long)pvVar10);
              if (((uint)flags >> 10 & 1) != 0) {
                pJVar15 = &info->crop_width;
                pJVar4 = &info->crop_height;
                if (info->crop == 0) {
                  pJVar15 = (JDIMENSION *)((long)handle + 0x238);
                  pJVar4 = (JDIMENSION *)((long)handle + 0x23c);
                }
                uVar12 = tjBufSize(*pJVar15,*pJVar4,jpegSubsamp);
                dstSizes[uVar20] = uVar12;
                iVar5 = 0;
              }
              if ((t[uVar20].options & 0x10) == 0) {
                jpeg_mem_dest_tj((j_compress_ptr)handle,dstBufs + uVar20,dstSizes + uVar20,iVar5);
              }
              ptVar1 = t + uVar20;
              jpeg_copy_critical_parameters(cinfo,(j_compress_ptr)handle);
              coef_arrays = jtransform_adjust_parameters
                                      (cinfo,(j_compress_ptr)handle,src_coef_arrays,info);
              if ((((uint)flags >> 0xe & 1) != 0) ||
                 (uVar21 = ptVar1->options, (uVar21 & 0x20) != 0)) {
                jpeg_simple_progression((j_compress_ptr)handle);
                uVar21 = ptVar1->options;
              }
              if ((uVar21 & 0x10) == 0) {
                jpeg_write_coefficients((j_compress_ptr)handle,coef_arrays);
                jcopy_markers_execute
                          (cinfo,(j_compress_ptr)handle,(uint)~ptVar1->options >> 5 & JCOPYOPT_ALL);
              }
              else {
                jinit_c_master_control((j_compress_ptr)handle,1);
              }
              jtransform_execute_transform(cinfo,(j_compress_ptr)handle,src_coef_arrays,info);
              if ((ptVar1->customFilter !=
                   (_func_int_short_ptr_tjregion_tjregion_int_int_tjtransform_ptr *)0x0) &&
                 (iVar7 = *(int *)((long)handle + 0x4c), 0 < iVar7)) {
                lVar11 = 0;
                do {
                  lVar14 = *(long *)((long)handle + 0x58);
                  lVar19 = lVar11 * 0x60;
                  uVar21 = *(uint *)(lVar14 + 0x20 + lVar19);
                  if (uVar21 != 0) {
                    lVar2 = lVar14 + lVar19;
                    uVar13 = (ulong)(uint)(*(int *)(lVar14 + 0x1c + lVar19) << 3);
                    uVar16 = uVar13 | 0x800000000;
                    iVar7 = *(int *)(lVar2 + 0xc);
                    uVar25 = 0;
                    uVar24 = uVar25;
                    do {
                      lVar14 = (**(code **)(*(long *)((long)handle + 0x210) + 0x40))
                                         (cinfo,coef_arrays[lVar11],uVar25,iVar7,1);
                      iVar7 = *(int *)(lVar2 + 0xc);
                      if (0 < iVar7) {
                        lVar19 = 0;
                        do {
                          tVar28.w = (int)uVar16;
                          tVar28.h = (int)(uVar16 >> 0x20);
                          tVar28.x = (int)uVar24;
                          tVar28.y = (int)(uVar24 >> 0x20);
                          auVar3._8_8_ = 0;
                          auVar3._0_8_ = (ulong)uVar21 << 0x23 | uVar13;
                          iVar7 = (*ptVar1->customFilter)
                                            (*(short **)(lVar14 + lVar19 * 8),tVar28,
                                             (tjregion)(auVar3 << 0x40),(int)lVar11,(int)uVar20,
                                             ptVar1);
                          if (iVar7 == -1) {
                            builtin_strncpy((char *)((long)handle + 0x618),"rror in ",8);
                            builtin_strncpy((char *)((long)handle + 0x620),"custom f",8);
                            builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
                            builtin_strncpy((char *)((long)handle + 0x610),"orm(): E",8);
                            *(undefined8 *)((long)handle + 0x626) = 0x7265746c696620;
                            *(undefined4 *)((long)handle + 0x6d0) = 1;
                            pcVar23 = (char *)__tls_get_addr(&PTR_0019ef20);
                            builtin_strncpy(pcVar23,"tjTransform(): Error in custom filter",0x26);
                            goto LAB_0013bbd4;
                          }
                          uVar24 = uVar24 + 0x800000000;
                          lVar19 = lVar19 + 1;
                          iVar7 = *(int *)(lVar2 + 0xc);
                        } while (lVar19 < iVar7);
                      }
                      uVar17 = (int)uVar25 + iVar7;
                      uVar25 = (ulong)uVar17;
                    } while (uVar17 < *(uint *)(lVar2 + 0x20));
                    iVar7 = *(int *)((long)handle + 0x4c);
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 < iVar7);
              }
              if ((ptVar1->options & 0x10) == 0) {
                jpeg_finish_compress((j_compress_ptr)handle);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != (uint)n);
            jpeg_finish_decompress(cinfo);
            uVar21 = 0;
            goto LAB_0013bbd8;
          }
          memcpy((void *)((long)handle + 0x608),
                 "tjTransform(): Could not determine subsampling type for JPEG image",0x43);
          *(undefined4 *)((long)handle + 0x6d0) = 1;
          __dest = (void *)__tls_get_addr(&PTR_0019ef20);
          memcpy(__dest,"tjTransform(): Could not determine subsampling type for JPEG image",0x43);
          iVar5 = 1;
        }
        else {
          iVar5 = 1;
        }
      }
LAB_0013bbd4:
      uVar21 = 0xffffffff;
      goto LAB_0013bbd8;
    }
    builtin_strncpy((char *)((long)handle + 0x618),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x620),"rgument",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjTransf",8);
    builtin_strncpy((char *)((long)handle + 0x610),"orm(): I",8);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar23 = (char *)__tls_get_addr(&PTR_0019ef20);
    builtin_strncpy(pcVar23,"tjTransform(): Invalid argument",0x20);
  }
  else {
    memcpy((void *)((long)handle + 0x608),
           "tjTransform(): Instance has not been initialized for transformation",0x44);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pvVar10 = (void *)__tls_get_addr(&PTR_0019ef20);
    memcpy(pvVar10,"tjTransform(): Instance has not been initialized for transformation",0x44);
  }
  uVar21 = 0xffffffff;
  iVar5 = 1;
  pvVar10 = (void *)0x0;
LAB_0013bbd8:
  if (100 < *(int *)((long)handle + 0x24)) {
    if (iVar5 != 0) {
      (**(code **)(*(long *)((long)handle + 0x28) + 0x20))(handle);
    }
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(cinfo);
  }
  free(pvVar10);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar21;
}

Assistant:

DLLEXPORT int tjTransform(tjhandle handle, const unsigned char *jpegBuf,
                          unsigned long jpegSize, int n,
                          unsigned char **dstBufs, unsigned long *dstSizes,
                          tjtransform *t, int flags)
{
  jpeg_transform_info *xinfo = NULL;
  jvirt_barray_ptr *srccoefs, *dstcoefs;
  int retval = 0, alloc = 1, i, jpegSubsamp, saveMarkers = 0;
  struct my_progress_mgr progress;

  GET_INSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & COMPRESS) == 0 || (this->init & DECOMPRESS) == 0)
    THROW("tjTransform(): Instance has not been initialized for transformation");

  if (jpegBuf == NULL || jpegSize <= 0 || n < 1 || dstBufs == NULL ||
      dstSizes == NULL || t == NULL || flags < 0)
    THROW("tjTransform(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if ((xinfo =
       (jpeg_transform_info *)malloc(sizeof(jpeg_transform_info) * n)) == NULL)
    THROW("tjTransform(): Memory allocation failure");
  MEMZERO(xinfo, sizeof(jpeg_transform_info) * n);

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);

  for (i = 0; i < n; i++) {
    xinfo[i].transform = xformtypes[t[i].op];
    xinfo[i].perfect = (t[i].options & TJXOPT_PERFECT) ? 1 : 0;
    xinfo[i].trim = (t[i].options & TJXOPT_TRIM) ? 1 : 0;
    xinfo[i].force_grayscale = (t[i].options & TJXOPT_GRAY) ? 1 : 0;
    xinfo[i].crop = (t[i].options & TJXOPT_CROP) ? 1 : 0;
    if (n != 1 && t[i].op == TJXOP_HFLIP) xinfo[i].slow_hflip = 1;
    else xinfo[i].slow_hflip = 0;

    if (xinfo[i].crop) {
      xinfo[i].crop_xoffset = t[i].r.x;  xinfo[i].crop_xoffset_set = JCROP_POS;
      xinfo[i].crop_yoffset = t[i].r.y;  xinfo[i].crop_yoffset_set = JCROP_POS;
      if (t[i].r.w != 0) {
        xinfo[i].crop_width = t[i].r.w;  xinfo[i].crop_width_set = JCROP_POS;
      } else
        xinfo[i].crop_width = JCROP_UNSET;
      if (t[i].r.h != 0) {
        xinfo[i].crop_height = t[i].r.h;  xinfo[i].crop_height_set = JCROP_POS;
      } else
        xinfo[i].crop_height = JCROP_UNSET;
    }
    if (!(t[i].options & TJXOPT_COPYNONE)) saveMarkers = 1;
  }

  jcopy_markers_setup(dinfo, saveMarkers ? JCOPYOPT_ALL : JCOPYOPT_NONE);
  jpeg_read_header(dinfo, TRUE);
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjTransform(): Could not determine subsampling type for JPEG image");

  for (i = 0; i < n; i++) {
    if (!jtransform_request_workspace(dinfo, &xinfo[i]))
      THROW("tjTransform(): Transform is not perfect");

    if (xinfo[i].crop) {
      if ((t[i].r.x % xinfo[i].iMCU_sample_width) != 0 ||
          (t[i].r.y % xinfo[i].iMCU_sample_height) != 0) {
        snprintf(this->errStr, JMSG_LENGTH_MAX,
                 "To crop this JPEG image, x must be a multiple of %d\n"
                 "and y must be a multiple of %d.\n",
                 xinfo[i].iMCU_sample_width, xinfo[i].iMCU_sample_height);
        this->isInstanceError = TRUE;
        retval = -1;  goto bailout;
      }
    }
  }

  srccoefs = jpeg_read_coefficients(dinfo);

  for (i = 0; i < n; i++) {
    int w, h;

    if (!xinfo[i].crop) {
      w = dinfo->image_width;  h = dinfo->image_height;
    } else {
      w = xinfo[i].crop_width;  h = xinfo[i].crop_height;
    }
    if (flags & TJFLAG_NOREALLOC) {
      alloc = 0;  dstSizes[i] = tjBufSize(w, h, jpegSubsamp);
    }
    if (!(t[i].options & TJXOPT_NOOUTPUT))
      jpeg_mem_dest_tj(cinfo, &dstBufs[i], &dstSizes[i], alloc);
    jpeg_copy_critical_parameters(dinfo, cinfo);
    dstcoefs = jtransform_adjust_parameters(dinfo, cinfo, srccoefs, &xinfo[i]);
    if (flags & TJFLAG_PROGRESSIVE || t[i].options & TJXOPT_PROGRESSIVE)
      jpeg_simple_progression(cinfo);
    if (!(t[i].options & TJXOPT_NOOUTPUT)) {
      jpeg_write_coefficients(cinfo, dstcoefs);
      jcopy_markers_execute(dinfo, cinfo, t[i].options & TJXOPT_COPYNONE ?
                                          JCOPYOPT_NONE : JCOPYOPT_ALL);
    } else
      jinit_c_master_control(cinfo, TRUE);
    jtransform_execute_transformation(dinfo, cinfo, srccoefs, &xinfo[i]);
    if (t[i].customFilter) {
      int ci, y;
      JDIMENSION by;

      for (ci = 0; ci < cinfo->num_components; ci++) {
        jpeg_component_info *compptr = &cinfo->comp_info[ci];
        tjregion arrayRegion = {
          0, 0, compptr->width_in_blocks * DCTSIZE, DCTSIZE
        };
        tjregion planeRegion = {
          0, 0, compptr->width_in_blocks * DCTSIZE,
          compptr->height_in_blocks * DCTSIZE
        };

        for (by = 0; by < compptr->height_in_blocks;
             by += compptr->v_samp_factor) {
          JBLOCKARRAY barray = (dinfo->mem->access_virt_barray)
            ((j_common_ptr)dinfo, dstcoefs[ci], by, compptr->v_samp_factor,
             TRUE);

          for (y = 0; y < compptr->v_samp_factor; y++) {
            if (t[i].customFilter(barray[y][0], arrayRegion, planeRegion, ci,
                                  i, &t[i]) == -1)
              THROW("tjTransform(): Error in custom filter");
            arrayRegion.y += DCTSIZE;
          }
        }
      }
    }
    if (!(t[i].options & TJXOPT_NOOUTPUT)) jpeg_finish_compress(cinfo);
  }

  jpeg_finish_decompress(dinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  free(xinfo);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}